

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::ConvertWCharTImpl
          (anon_unknown_53 *this,wchar_t v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  size_t sVar2;
  undefined4 in_register_00000034;
  string_view v_00;
  FormatConversionSpecImpl conv_00;
  ShiftState s;
  char mb [4];
  ShiftState local_1e;
  char local_1c [4];
  
  conv_00.width_ = in_register_00000034;
  conv_00._0_4_ = v;
  local_1e.saw_high_surrogate = false;
  local_1e.bits = '\0';
  sVar2 = WideToUtf8((wchar_t)this,local_1c,&local_1e);
  if ((sVar2 == 0xffffffffffffffff) || (local_1e.saw_high_surrogate != false)) {
    bVar1 = false;
  }
  else {
    v_00._M_str = local_1c;
    v_00._M_len = sVar2;
    conv_00.precision_ = conv._0_4_;
    bVar1 = ConvertStringArg(v_00,conv_00,
                             (FormatSinkImpl *)
                             CONCAT44((int)((ulong)register0x00000008 >> 0x20),conv.precision_));
  }
  return bVar1;
}

Assistant:

bool ConvertWCharTImpl(wchar_t v, const FormatConversionSpecImpl conv,
                       FormatSinkImpl *sink) {
  char mb[4];
  ShiftState s;
  const size_t chars_written = WideToUtf8(v, mb, s);
  return chars_written != static_cast<size_t>(-1) && !s.saw_high_surrogate &&
         ConvertStringArg(string_view(mb, chars_written), conv, sink);
}